

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

MessageOptions * __thiscall google::protobuf::MessageOptions::New(MessageOptions *this,Arena *arena)

{
  MessageOptions *this_00;
  
  this_00 = (MessageOptions *)operator_new(0x70);
  MessageOptions(this_00);
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::MessageOptions>(arena,this_00);
  }
  return this_00;
}

Assistant:

MessageOptions* MessageOptions::New(::google::protobuf::Arena* arena) const {
  MessageOptions* n = new MessageOptions;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}